

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O1

int dwarf_get_fde_augmentation_data
              (Dwarf_Fde_conflict fde,Dwarf_Small **augdata,Dwarf_Unsigned *augdata_len,
              Dwarf_Error *error)

{
  Dwarf_Signed errval;
  
  if (fde == (Dwarf_Fde_conflict)0x0) {
    errval = 0x5c;
  }
  else {
    if (fde->fd_gnu_eh_aug_present == 0) {
      return -1;
    }
    if (fde->fd_cie != (Dwarf_Cie_conflict)0x0) {
      *augdata = (Dwarf_Small *)fde->fd_gnu_eh_augmentation_bytes;
      *augdata_len = fde->fd_gnu_eh_augmentation_len;
      return 0;
    }
    errval = 0x5e;
  }
  _dwarf_error((Dwarf_Debug)0x0,error,errval);
  return 1;
}

Assistant:

int
dwarf_get_fde_augmentation_data(Dwarf_Fde fde,
    Dwarf_Small * *augdata,
    Dwarf_Unsigned * augdata_len,
    Dwarf_Error * error)
{
    Dwarf_Cie cie = 0;

    if (fde == NULL) {
        _dwarf_error(NULL, error, DW_DLE_FDE_NULL);
        return DW_DLV_ERROR;
    }
    if (!fde->fd_gnu_eh_aug_present) {
        return DW_DLV_NO_ENTRY;
    }
    cie = fde->fd_cie;
    if (cie == NULL) {
        _dwarf_error(NULL, error, DW_DLE_CIE_NULL);
        return DW_DLV_ERROR;
    }
    *augdata = (Dwarf_Small *) fde->fd_gnu_eh_augmentation_bytes;
    *augdata_len = fde->fd_gnu_eh_augmentation_len;
    return DW_DLV_OK;
}